

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O2

void handleTotalMassOptions(KinDynComputations *comp,parser *cmd)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  size_t l;
  ulong uVar5;
  double dVar6;
  allocator<char> local_49;
  double local_48;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"total-mass",&local_49);
  bVar1 = cmdline::parser::exist(cmd,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    lVar2 = iDynTree::KinDynComputations::getRobotModel();
    local_48 = 0.0;
    uVar5 = 0;
    while( true ) {
      uVar3 = iDynTree::Model::getNrOfLinks();
      if (uVar3 <= uVar5) break;
      iDynTree::Model::getLink(lVar2);
      iDynTree::Link::getInertia();
      dVar6 = (double)iDynTree::SpatialInertia::getMass();
      local_48 = local_48 + dVar6;
      uVar5 = uVar5 + 1;
    }
    std::operator<<((ostream *)&std::cout,"The total mass of model is ");
    poVar4 = std::ostream::_M_insert<double>(local_48);
    poVar4 = std::operator<<(poVar4," Kg.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return;
}

Assistant:

void handleTotalMassOptions(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    if( !cmd.exist("total-mass") )
    {
        return;
    }

    double totalMass = 0.0;

    const iDynTree::Model & model = comp.getRobotModel();

    for(size_t l=0; l < model.getNrOfLinks(); l++)
    {
        totalMass += model.getLink(l)->getInertia().getMass();
    }

    std::cout << "The total mass of model is "
                  << totalMass << " Kg." << std::endl;
}